

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

CVmNetFile *
CVmObjFile::get_filename_arg
          (vm_val_t *arg,vm_rcdesc *rc,int access,int is_resource_file,os_filetype_t file_type,
          char *mime_type)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  long *plVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  uint in_R8D;
  undefined8 in_R9;
  err_frame_t err_cur__;
  char fname [4096];
  CVmNetFile *netfile;
  int nmode;
  CVmNetFile *in_stack_ffffffffffffeed0;
  undefined8 uVar5;
  undefined8 in_stack_ffffffffffffeed8;
  vm_val_t *val;
  int access_00;
  undefined4 in_stack_ffffffffffffeee0;
  int in_stack_ffffffffffffeee8;
  int in_stack_ffffffffffffeeec;
  char *in_stack_ffffffffffffeef0;
  void *local_1108;
  __jmp_buf_tag _Stack_1100;
  vm_val_t local_1038 [256];
  CVmNetFile *local_38;
  uint local_2c;
  int local_18;
  
  access_00 = (int)((ulong)in_stack_ffffffffffffeed8 >> 0x20);
  if (in_EDX == 1) {
    local_2c = 1;
  }
  else if (in_EDX == 2) {
    local_2c = 0xe;
  }
  else if (in_EDX == 3) {
    local_2c = 7;
  }
  else if (in_EDX == 4) {
    local_2c = 0xf;
  }
  else if (in_EDX == 0x1000) {
    local_2c = 0x10;
  }
  else {
    if (5 < in_EDX - 0x1001U) {
      err_throw(0);
    }
    local_2c = 0;
  }
  local_38 = (CVmNetFile *)0x0;
  local_18 = in_ECX;
  if (in_ECX == 0) {
    iVar1 = CVmNetFile::open(in_RDI,in_ESI,(ulong)local_2c,(ulong)in_R8D,in_R9);
    local_38 = (CVmNetFile *)CONCAT44(extraout_var,iVar1);
  }
  else {
    val = local_1038;
    CVmBif::get_str_val(val);
    CVmBif::get_str_val_fname
              ((char *)CONCAT44(in_EDX,in_stack_ffffffffffffeee0),(size_t)val,
               (char *)in_stack_ffffffffffffeed0);
    access_00 = (int)((ulong)val >> 0x20);
    local_38 = CVmNetFile::open_local
                         (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
                          in_stack_ffffffffffffeee8,in_EDX);
  }
  if (local_18 == 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    uVar5 = *puVar3;
    plVar4 = (long *)_ZTW11G_err_frame();
    *plVar4 = (long)&stack0xffffffffffffeee8;
    uVar2 = _setjmp(&_Stack_1100);
    if (uVar2 == 0) {
      check_safety_for_open((CVmNetFile *)CONCAT44(in_EDX,in_stack_ffffffffffffeee0),access_00);
    }
    if (uVar2 == 1) {
      uVar2 = 2;
      CVmNetFile::abandon(in_stack_ffffffffffffeed0);
      err_rethrow();
    }
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    *puVar3 = uVar5;
    if ((uVar2 & 0x4001) != 0) {
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar3 & 2) != 0) {
        plVar4 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar4 + 0x10));
      }
      plVar4 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar4 + 0x10) = local_1108;
      err_rethrow();
    }
    if ((uVar2 & 2) != 0) {
      free(local_1108);
    }
  }
  return local_38;
}

Assistant:

CVmNetFile *CVmObjFile::get_filename_arg(
    VMG_ const vm_val_t *arg, const vm_rcdesc *rc,
    int access, int is_resource_file,
    os_filetype_t file_type, const char *mime_type)
{
    /* figure the network file access mode */
    int nmode;
    switch (access)
    {
    case VMOBJFILE_ACCESS_READ:
        /* read access; file must exist */
        nmode = NETF_READ;
        break;

    case VMOBJFILE_ACCESS_WRITE:
        /* write access; create or replace existing file */ 
        nmode = NETF_WRITE | NETF_CREATE | NETF_TRUNC;
        break;

    case VMOBJFILE_ACCESS_RW_KEEP:
        /* read/write access; keep an existing file or create a new one */
        nmode = NETF_READ | NETF_WRITE | NETF_CREATE;
        break;

    case VMOBJFILE_ACCESS_RW_TRUNC:
        /* read/write access; truncate an existing file or create a new one */
        nmode = NETF_READ | NETF_WRITE | NETF_CREATE | NETF_TRUNC;
        break;

    case VMOBJFILE_ACCESS_DELETE:
        /* delete mode */
        nmode = NETF_DELETE;
        break;

    case VMOBJFILE_ACCESS_GETINFO:
    case VMOBJFILE_ACCESS_MKDIR:
    case VMOBJFILE_ACCESS_RMDIR:
    case VMOBJFILE_ACCESS_READDIR:
    case VMOBJFILE_ACCESS_RENAME_TO:
    case VMOBJFILE_ACCESS_RENAME_FROM:
        /* 
         *   getFileType/getFileInfo/rename/directory manipulation - we don't
         *   need to open the file at all for these operations
         */
        nmode = 0;
        break;

    default:
        /* invalid mode */
        err_throw(VMERR_BAD_VAL_BIF);
    }

    /* we don't have a network file descriptor yet */
    CVmNetFile *netfile = 0;
    char fname[OSFNMAX];

    /* check to see what kind of file spec we have */
    if (is_resource_file)
    {
        /* a resource file must be given as a string name - retrieve it */
        CVmBif::get_str_val_fname(vmg_ fname, sizeof(fname),
                                  CVmBif::get_str_val(vmg_ arg));

        /* resources are always local, so create a local file descriptor */
        netfile = CVmNetFile::open_local(vmg_ fname, 0, nmode, file_type);
    }
    else
    {
        /* regular file - create the network file descriptor */
        netfile = CVmNetFile::open(
            vmg_ arg, rc, nmode, file_type, mime_type);
    }
    
    /* 
     *   If this isn't a resource file, check the file safety mode to see if
     *   the operation is allowed.  Reading resources is always allowed,
     *   regardless of the safety mode, since resources are read-only and are
     *   inherently constrained in the paths they can access.  
     */
    if (!is_resource_file)
    {
        err_try
        {
            check_safety_for_open(vmg_ netfile, access);
        }
        err_catch_disc
        {
            /* abandon the net file descriptor and bubble up the error */
            netfile->abandon(vmg0_);
            err_rethrow();
        }